

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void deleteenv(void)

{
  Env *pEVar1;
  Env *pEVar2;
  
  pEVar2 = current;
  if (current != (Env *)0x0) {
    pEVar1 = current->pre;
    Env::~Env(current);
    operator_delete(pEVar2);
    current = pEVar1;
  }
  return;
}

Assistant:

void deleteenv() {
    if (current == NULL) return;
    Env *pre = current->getpre();
    delete current;
    current = pre;
}